

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

AssertionExpr *
slang::ast::UnaryAssertionExpr::fromSyntax(UnaryPropertyExprSyntax *syntax,ASTContext *context)

{
  Scope *pSVar1;
  AssertionExpr *this;
  Compilation *this_00;
  int iVar2;
  undefined4 extraout_var;
  UnaryAssertionExpr *pUVar3;
  char *func;
  bitmask<slang::ast::ASTFlags> addedFlags;
  UnaryAssertionOperator op;
  UnaryAssertionOperator local_5c;
  ASTContext local_58;
  
  local_5c = getUnaryOp((syntax->op).kind);
  pSVar1 = (context->scope).ptr;
  if (pSVar1 == (Scope *)0x0) {
    func = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
  }
  else {
    this = (AssertionExpr *)(syntax->expr).ptr;
    if (this != (AssertionExpr *)0x0) {
      this_00 = pSVar1->compilation;
      addedFlags.m_bits = 0x1000000;
      if (local_5c != NextTime) {
        addedFlags.m_bits = (underlying_type)((~local_5c & 1) << 0x17);
      }
      ASTContext::resetFlags(&local_58,context,addedFlags);
      iVar2 = AssertionExpr::bind(this,(int)&local_58,(sockaddr *)0x0,0);
      pUVar3 = BumpAllocator::
               emplace<slang::ast::UnaryAssertionExpr,slang::ast::UnaryAssertionOperator&,slang::ast::AssertionExpr_const&,std::nullopt_t_const&>
                         (&this_00->super_BumpAllocator,&local_5c,
                          (AssertionExpr *)CONCAT44(extraout_var,iVar2),(nullopt_t *)&std::nullopt);
      return &pUVar3->super_AssertionExpr;
    }
    func = 
    "T slang::not_null<slang::syntax::PropertyExprSyntax *>::get() const [T = slang::syntax::PropertyExprSyntax *]"
    ;
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

AssertionExpr& UnaryAssertionExpr::fromSyntax(const UnaryPropertyExprSyntax& syntax,
                                              const ASTContext& context) {
    auto op = getUnaryOp(syntax.op.kind);

    bitmask<ASTFlags> extraFlags;
    if (op == UnaryAssertionOperator::NextTime)
        extraFlags = ASTFlags::PropertyTimeAdvance;
    else if (isNegationOp(op))
        extraFlags = ASTFlags::PropertyNegation;

    auto& comp = context.getCompilation();
    auto& expr = bind(*syntax.expr, context.resetFlags(extraFlags));
    return *comp.emplace<UnaryAssertionExpr>(op, expr, std::nullopt);
}